

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevDevice.h
# Opt level: O2

bool __thiscall
axl::sys::lnx::UdevDevice::createFromSysPath(UdevDevice *this,udev *ctx,StringRef *path)

{
  undefined *puVar1;
  bool bVar2;
  C *pCVar3;
  udev_device *puVar4;
  
  puVar1 = libudev::udev_device_new_from_syspath;
  pCVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(path);
  puVar4 = (udev_device *)(*(code *)puVar1)(ctx,pCVar3);
  if ((this->
      super_Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
      ).m_h != (udev_device *)0x0) {
    (*(code *)libudev::udev_device_unref)();
  }
  (this->
  super_Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
  ).m_h = puVar4;
  if (puVar4 != (udev_device *)0x0) {
    return true;
  }
  bVar2 = failWithUdevError("udev_device_new_from_syspath");
  return bVar2;
}

Assistant:

bool
	createFromSysPath(
		udev* ctx,
		const sl::StringRef& path
	) {
		attach(udev_device_new_from_syspath(ctx, path.sz()));
		return completeUdev(m_h, "udev_device_new_from_syspath");
	}